

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::CloneFilterOperation::setString
          (CloneFilterOperation *this,string_view property,string_view val)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  InvalidParameter *this_00;
  string_view message;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  allocator<char> local_c2;
  allocator<char> local_c1;
  handle handle;
  string_view val_local;
  string_view property_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  val_local._M_str = val._M_str;
  val_local._M_len = val._M_len;
  property_local._M_str = property._M_str;
  property_local._M_len = property._M_len;
  __y._M_str = "delivery";
  __y._M_len = 8;
  bVar3 = std::operator==(property,__y);
  if (bVar3) {
    gmlc::libguarded::
    shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::lock(&handle,&this->deliveryAddresses);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)handle.data);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)handle.data,
               (basic_string_view<char,_std::char_traits<char>_> *)&val_local);
  }
  else {
    __y_00._M_str = "add delivery";
    __y_00._M_len = 0xc;
    bVar3 = std::operator==(property,__y_00);
    if (bVar3) {
      gmlc::libguarded::
      shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(&handle,&this->deliveryAddresses);
      pbVar1 = ((handle.data)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = ((handle.data)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar1 == pbVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)handle.data,
                   (basic_string_view<char,_std::char_traits<char>_> *)&val_local);
      }
      else {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                          (pbVar1,pbVar2,&val_local);
        if (_Var4._M_current ==
            ((handle.data)->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     handle.data,(basic_string_view<char,_std::char_traits<char>_> *)&val_local);
        }
      }
    }
    else {
      __y_01._M_str = "remove delivery";
      __y_01._M_len = 0xf;
      bVar3 = std::operator==(property,__y_01);
      if (!bVar3) {
        this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"property ",&local_c1);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_80,&property_local,&local_c2);
        std::operator+(&local_40,&local_60,&local_80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                       &local_40," is not a known property");
        message._M_str = (char *)handle.data;
        message._M_len = (size_t)handle.m_handle_lock._M_device;
        InvalidParameter::InvalidParameter(this_00,message);
        __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
      }
      gmlc::libguarded::
      shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(&handle,&this->deliveryAddresses);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                        (((handle.data)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         ((handle.data)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&val_local);
      if (_Var4._M_current !=
          ((handle.data)->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)handle.data,(const_iterator)_Var4._M_current);
      }
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&handle.m_handle_lock);
  return;
}

Assistant:

void CloneFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "delivery") {
        auto handle = deliveryAddresses.lock();
        handle->clear();
        handle->emplace_back(val);
    } else if (property == "add delivery") {
        auto handle = deliveryAddresses.lock();
        if (handle->empty()) {
            handle->emplace_back(val);
        } else {
            auto fnd = std::find(handle->cbegin(), handle->cend(), val);
            if (fnd == handle->cend()) {
                handle->emplace_back(val);
            }
        }
    } else if (property == "remove delivery") {
        auto handle = deliveryAddresses.lock();
        auto fnd = std::find(handle->cbegin(), handle->cend(), val);
        if (fnd != handle->cend()) {
            handle->erase(fnd);
        }
    } else {
        throw(helics::InvalidParameter(std::string(
            std::string("property ") + std::string(property) + " is not a known property")));
    }
}